

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFI.h
# Opt level: O1

void __thiscall dg::pta::PointerAnalysisFI::~PointerAnalysisFI(PointerAnalysisFI *this)

{
  (this->super_PointerAnalysis)._vptr_PointerAnalysis =
       (_func_int **)&PTR__PointerAnalysisFI_00122ae8;
  std::
  vector<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::allocator<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
  ::~vector(&this->memory_objects);
  PointerAnalysis::~PointerAnalysis(&this->super_PointerAnalysis);
  operator_delete(this,0xa0);
  return;
}

Assistant:

void preprocessGEPs() {
        // if a node is in a loop (a scc that has more than one node),
        // then every GEP that is also stored to the same memory afterwards
        // in the loop will end up with Offset::UNKNOWN after some
        // number of iterations (in FI analysis), so we can do that right now
        // and save iterations

        assert(getPG() && "Must have PG");
        for (const auto &sg : getPG()->getSubgraphs()) {
            for (const auto &loop : sg->getLoops()) {
                for (PSNode *n : loop) {
                    if (PSNodeGep *gep = PSNodeGep::get(n))
                        gep->setOffset(Offset::UNKNOWN);
                }
            }
        }
    }